

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genDumpFunction_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  undefined8 *puVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_t sVar7;
  View *pVVar8;
  Attribute *pAVar9;
  ulong *puVar10;
  size_type *psVar11;
  long *plVar12;
  ulong uVar13;
  long lVar14;
  char cVar15;
  undefined8 uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  size_t __result;
  ulong uVar18;
  string __str_2;
  string fields;
  string __str_1;
  string __str;
  ulong *local_368;
  long local_360;
  ulong local_358;
  long lStack_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  ulong *local_328;
  long local_320;
  ulong local_318;
  long lStack_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  CppGenerator *local_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230;
  long lStack_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  long lStack_1a8;
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  long lStack_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  long local_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  ulong local_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_288 = this;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct((ulong)&local_240,'\x03');
  puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,0x2ac89e);
  local_2e8 = &local_2d8;
  puVar10 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar10) {
    local_2d8 = *puVar10;
    lStack_2d0 = puVar5[3];
  }
  else {
    local_2d8 = *puVar10;
    local_2e8 = (ulong *)*puVar5;
  }
  local_2e0 = puVar5[1];
  *puVar5 = puVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  local_328 = &local_318;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_318 = *puVar10;
    lStack_310 = plVar6[3];
  }
  else {
    local_318 = *puVar10;
    local_328 = (ulong *)*plVar6;
  }
  local_320 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_2c8 = &local_2b8;
  std::__cxx11::string::_M_construct((ulong)&local_2c8,'\x03');
  uVar18 = 0xf;
  if (local_328 != &local_318) {
    uVar18 = local_318;
  }
  if (uVar18 < (ulong)(local_2c0 + local_320)) {
    uVar18 = 0xf;
    if (local_2c8 != &local_2b8) {
      uVar18 = local_2b8;
    }
    if (uVar18 < (ulong)(local_2c0 + local_320)) goto LAB_0022894a;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_328);
  }
  else {
LAB_0022894a:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_2c8);
  }
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  psVar11 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_348.field_2._M_allocated_capacity = *psVar11;
    local_348.field_2._8_8_ = puVar5[3];
  }
  else {
    local_348.field_2._M_allocated_capacity = *psVar11;
    local_348._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_348._M_string_length = puVar5[1];
  *puVar5 = psVar11;
  puVar5[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_348);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_358 = *puVar10;
    lStack_350 = plVar6[3];
    local_368 = &local_358;
  }
  else {
    local_358 = *puVar10;
    local_368 = (ulong *)*plVar6;
  }
  local_360 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_260 = &local_250;
  std::__cxx11::string::_M_construct((ulong)&local_260,'\x06');
  uVar18 = 0xf;
  if (local_368 != &local_358) {
    uVar18 = local_358;
  }
  if (uVar18 < (ulong)(local_258 + local_360)) {
    uVar18 = 0xf;
    if (local_260 != &local_250) {
      uVar18 = local_250;
    }
    if ((ulong)(local_258 + local_360) <= uVar18) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_368);
      goto LAB_00228a96;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_260);
LAB_00228a96:
  local_308 = &local_2f8;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_2f8 = *plVar6;
    lStack_2f0 = puVar5[3];
  }
  else {
    local_2f8 = *plVar6;
    local_308 = (long *)*puVar5;
  }
  local_300 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_308);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    lVar14 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar14;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_308 != &local_2f8) {
    operator_delete(local_308);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  uVar18 = 0;
  do {
    paVar17 = &local_348.field_2;
    sVar7 = QueryCompiler::numberOfViews
                      ((local_288->_qc).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar7 <= uVar18) {
      local_348._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct((ulong)&local_348,'\x03');
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_348);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_358 = *puVar10;
        lStack_350 = plVar6[3];
        local_368 = &local_358;
      }
      else {
        local_358 = *puVar10;
        local_368 = (ulong *)*plVar6;
      }
      local_360 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_368);
      local_308 = &local_2f8;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_2f8 = *plVar12;
        lStack_2f0 = plVar6[3];
      }
      else {
        local_2f8 = *plVar12;
        local_308 = (long *)*plVar6;
      }
      local_300 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_308);
      if (local_308 != &local_2f8) {
        operator_delete(local_308);
      }
      if (local_368 != &local_358) {
        operator_delete(local_368);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar17) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
    local_118 = uVar18;
    pVVar8 = QueryCompiler::getView
                       ((local_288->_qc).
                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,uVar18)
    ;
    if (pVVar8->_origin == pVVar8->_destination) {
      local_280 = &local_270;
      std::__cxx11::string::_M_construct((ulong)&local_280,'\x06');
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_280);
      local_2a8 = &local_298;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_298 = *plVar12;
        lStack_290 = plVar6[3];
      }
      else {
        local_298 = *plVar12;
        local_2a8 = (long *)*plVar6;
      }
      local_2a0 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_160 = local_118 * 0x20;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_2a8,
                                  (ulong)local_288->viewName[local_118]._M_dataplus._M_p);
      local_260 = &local_250;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_250 = *puVar10;
        lStack_248 = plVar6[3];
      }
      else {
        local_250 = *puVar10;
        local_260 = (ulong *)*plVar6;
      }
      local_258 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_260);
      local_2c8 = &local_2b8;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_2b8 = *puVar10;
        lStack_2b0 = plVar6[3];
      }
      else {
        local_2b8 = *puVar10;
        local_2c8 = (ulong *)*plVar6;
      }
      local_2c0 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_1a0 = &local_190;
      std::__cxx11::string::_M_construct((ulong)&local_1a0,'\x06');
      uVar18 = 0xf;
      if (local_2c8 != &local_2b8) {
        uVar18 = local_2b8;
      }
      if (uVar18 < (ulong)(local_198 + local_2c0)) {
        uVar18 = 0xf;
        if (local_1a0 != &local_190) {
          uVar18 = local_190;
        }
        if (uVar18 < (ulong)(local_198 + local_2c0)) goto LAB_00228e4d;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_2c8);
      }
      else {
LAB_00228e4d:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_1a0);
      }
      puVar10 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar10) {
        local_230 = *puVar10;
        lStack_228 = puVar5[3];
        local_240 = &local_230;
      }
      else {
        local_230 = *puVar10;
        local_240 = (ulong *)*puVar5;
      }
      local_238 = puVar5[1];
      *puVar5 = puVar10;
      puVar5[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_2e8 = &local_2d8;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_2d8 = *puVar10;
        lStack_2d0 = plVar6[3];
      }
      else {
        local_2d8 = *puVar10;
        local_2e8 = (ulong *)*plVar6;
      }
      local_2e0 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      lVar14 = 0;
      uVar18 = 0;
      bVar2 = true;
      do {
        bVar4 = bVar2;
        uVar13 = (pVVar8->_fVars).super__Base_bitset<2UL>._M_w[lVar14];
        uVar13 = uVar13 - (uVar13 >> 1 & 0x5555555555555555);
        uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333);
        uVar18 = uVar18 + (((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
        ;
        lVar14 = 1;
        bVar2 = false;
      } while (bVar4);
      cVar15 = '\x01';
      if (9 < uVar18) {
        uVar13 = uVar18;
        cVar3 = '\x04';
        do {
          cVar15 = cVar3;
          if (uVar13 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_00228fec;
          }
          if (uVar13 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_00228fec;
          }
          if (uVar13 < 10000) goto LAB_00228fec;
          bVar2 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar3 = cVar15 + '\x04';
        } while (bVar2);
        cVar15 = cVar15 + '\x01';
      }
LAB_00228fec:
      local_1c0 = &local_1b0;
      std::__cxx11::string::_M_construct((ulong)&local_1c0,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1c0,(uint)local_1b8,uVar18);
      uVar18 = 0xf;
      if (local_2e8 != &local_2d8) {
        uVar18 = local_2d8;
      }
      if (uVar18 < (ulong)(local_1b8 + local_2e0)) {
        uVar18 = 0xf;
        if (local_1c0 != &local_1b0) {
          uVar18 = local_1b0;
        }
        if (uVar18 < (ulong)(local_1b8 + local_2e0)) goto LAB_0022908b;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_2e8);
      }
      else {
LAB_0022908b:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_1c0);
      }
      puVar10 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar10) {
        local_318 = *puVar10;
        lStack_310 = puVar5[3];
        local_328 = &local_318;
      }
      else {
        local_318 = *puVar10;
        local_328 = (ulong *)*puVar5;
      }
      local_320 = puVar5[1];
      *puVar5 = puVar10;
      puVar5[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_328);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_348.field_2._M_allocated_capacity = *puVar10;
        local_348.field_2._8_8_ = plVar6[3];
        local_348._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_348.field_2._M_allocated_capacity = *puVar10;
        local_348._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_348._M_string_length = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      uVar18 = (long)(pVVar8->_aggregates).
                     super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pVVar8->_aggregates).
                     super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      cVar15 = '\x01';
      if (9 < uVar18) {
        uVar13 = uVar18;
        cVar3 = '\x04';
        do {
          cVar15 = cVar3;
          if (uVar13 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_0022919d;
          }
          if (uVar13 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_0022919d;
          }
          if (uVar13 < 10000) goto LAB_0022919d;
          bVar2 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar3 = cVar15 + '\x04';
        } while (bVar2);
        cVar15 = cVar15 + '\x01';
      }
LAB_0022919d:
      local_1e0 = &local_1d0;
      std::__cxx11::string::_M_construct((ulong)&local_1e0,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1e0,(uint)local_1d8,uVar18);
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar17) {
        uVar16 = local_348.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_1d8 + local_348._M_string_length) {
        uVar18 = 0xf;
        if (local_1e0 != &local_1d0) {
          uVar18 = local_1d0;
        }
        if (uVar18 < local_1d8 + local_348._M_string_length) goto LAB_0022922e;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_348._M_dataplus._M_p);
      }
      else {
LAB_0022922e:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_1e0);
      }
      local_368 = &local_358;
      puVar10 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar10) {
        local_358 = *puVar10;
        lStack_350 = puVar5[3];
      }
      else {
        local_358 = *puVar10;
        local_368 = (ulong *)*puVar5;
      }
      local_360 = puVar5[1];
      *puVar5 = puVar10;
      puVar5[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_368);
      local_308 = &local_2f8;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_2f8 = *plVar12;
        lStack_2f0 = plVar6[3];
      }
      else {
        local_2f8 = *plVar12;
        local_308 = (long *)*plVar6;
      }
      local_300 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_308);
      if (local_308 != &local_2f8) {
        operator_delete(local_308);
      }
      if (local_368 != &local_358) {
        operator_delete(local_368);
      }
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar17) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328);
      }
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8);
      }
      if (local_280 != &local_270) {
        operator_delete(local_280);
      }
      local_308 = &local_2f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
      uVar18 = 0;
      do {
        if (((pVVar8->_fVars).super__Base_bitset<2UL>._M_w[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0
           ) {
          pAVar9 = TreeDecomposition::getAttribute
                             ((local_288->_td).
                              super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,uVar18);
          std::operator+(&local_348," << tuple.",&pAVar9->_name);
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
          local_368 = &local_358;
          puVar10 = puVar5 + 2;
          if ((ulong *)*puVar5 == puVar10) {
            local_358 = *puVar10;
            lStack_350 = puVar5[3];
          }
          else {
            local_358 = *puVar10;
            local_368 = (ulong *)*puVar5;
          }
          local_360 = puVar5[1];
          *puVar5 = puVar10;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_368);
          if (local_368 != &local_358) {
            operator_delete(local_368);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != paVar17) {
            operator_delete(local_348._M_dataplus._M_p);
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 100);
      if ((pVVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (pVVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar18 = 0;
        do {
          cVar15 = '\x01';
          if (9 < uVar18) {
            uVar13 = uVar18;
            cVar3 = '\x04';
            do {
              cVar15 = cVar3;
              if (uVar13 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_0022959f;
              }
              if (uVar13 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_0022959f;
              }
              if (uVar13 < 10000) goto LAB_0022959f;
              bVar2 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar3 = cVar15 + '\x04';
            } while (bVar2);
            cVar15 = cVar15 + '\x01';
          }
LAB_0022959f:
          local_328 = &local_318;
          std::__cxx11::string::_M_construct((ulong)&local_328,cVar15);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_328,(uint)local_320,uVar18)
          ;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,0x2b1923);
          puVar10 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_348.field_2._M_allocated_capacity = *puVar10;
            local_348.field_2._8_8_ = puVar5[3];
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          }
          else {
            local_348.field_2._M_allocated_capacity = *puVar10;
            local_348._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_348._M_string_length = puVar5[1];
          *puVar5 = puVar10;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
          local_368 = &local_358;
          puVar10 = puVar5 + 2;
          if ((ulong *)*puVar5 == puVar10) {
            local_358 = *puVar10;
            lStack_350 = puVar5[3];
          }
          else {
            local_358 = *puVar10;
            local_368 = (ulong *)*puVar5;
          }
          local_360 = puVar5[1];
          *puVar5 = puVar10;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_368);
          if (local_368 != &local_358) {
            operator_delete(local_368);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p);
          }
          if (local_328 != &local_318) {
            operator_delete(local_328);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < (ulong)((long)(pVVar8->_aggregates).
                                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pVVar8->_aggregates).
                                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x06');
      plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
      local_220 = &local_210;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_210 = *plVar12;
        lStack_208 = plVar6[3];
      }
      else {
        local_210 = *plVar12;
        local_220 = (long *)*plVar6;
      }
      local_218 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_220,
                                  *(ulong *)((long)&(local_288->viewName->_M_dataplus)._M_p +
                                            local_160));
      local_70 = &local_60;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_60 = *plVar12;
        lStack_58 = plVar6[3];
      }
      else {
        local_60 = *plVar12;
        local_70 = (long *)*plVar6;
      }
      local_68 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_158 = &local_148;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_148 = *puVar10;
        lStack_140 = plVar6[3];
      }
      else {
        local_148 = *puVar10;
        local_158 = (ulong *)*plVar6;
      }
      local_150 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,'\x06');
      uVar18 = 0xf;
      if (local_158 != &local_148) {
        uVar18 = local_148;
      }
      if (uVar18 < (ulong)(local_88 + local_150)) {
        uVar18 = 0xf;
        if (local_90 != local_80) {
          uVar18 = local_80[0];
        }
        if (uVar18 < (ulong)(local_88 + local_150)) goto LAB_00229913;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_158);
      }
      else {
LAB_00229913:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_90);
      }
      local_200 = &local_1f0;
      puVar1 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar1) {
        local_1f0 = *puVar1;
        uStack_1e8 = puVar5[3];
      }
      else {
        local_1f0 = *puVar1;
        local_200 = (undefined8 *)*puVar5;
      }
      local_1f8 = puVar5[1];
      *puVar5 = puVar1;
      puVar5[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
      local_138 = &local_128;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_128 = *puVar10;
        lStack_120 = plVar6[3];
      }
      else {
        local_128 = *puVar10;
        local_138 = (ulong *)*plVar6;
      }
      local_130 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct((ulong)&local_b0,'\t');
      uVar18 = 0xf;
      if (local_138 != &local_128) {
        uVar18 = local_128;
      }
      if (uVar18 < (ulong)(local_a8 + local_130)) {
        uVar18 = 0xf;
        if (local_b0 != local_a0) {
          uVar18 = local_a0[0];
        }
        if (uVar18 < (ulong)(local_a8 + local_130)) goto LAB_00229a7c;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_138);
      }
      else {
LAB_00229a7c:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_b0);
      }
      local_180 = &local_170;
      puVar1 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar1) {
        local_170 = *puVar1;
        uStack_168 = puVar5[3];
      }
      else {
        local_170 = *puVar1;
        local_180 = (undefined8 *)*puVar5;
      }
      local_178 = puVar5[1];
      *puVar5 = puVar1;
      puVar5[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_180,
                                  *(ulong *)((long)&(local_288->viewName->_M_dataplus)._M_p +
                                            local_160));
      local_1e0 = &local_1d0;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_1d0 = *puVar10;
        lStack_1c8 = plVar6[3];
      }
      else {
        local_1d0 = *puVar10;
        local_1e0 = (ulong *)*plVar6;
      }
      local_1d8 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e0);
      local_1c0 = &local_1b0;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_1b0 = *puVar10;
        lStack_1a8 = plVar6[3];
      }
      else {
        local_1b0 = *puVar10;
        local_1c0 = (ulong *)*plVar6;
      }
      local_1b8 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1c0,
                                  *(ulong *)((long)&(local_288->viewName->_M_dataplus)._M_p +
                                            local_160));
      local_1a0 = &local_190;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_190 = *puVar10;
        lStack_188 = plVar6[3];
      }
      else {
        local_190 = *puVar10;
        local_1a0 = (ulong *)*plVar6;
      }
      local_198 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
      local_280 = &local_270;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_270 = *puVar10;
        lStack_268 = plVar6[3];
      }
      else {
        local_270 = *puVar10;
        local_280 = (ulong *)*plVar6;
      }
      local_278 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct((ulong)&local_d0,'\t');
      uVar18 = 0xf;
      if (local_280 != &local_270) {
        uVar18 = local_270;
      }
      if (uVar18 < (ulong)(local_c8 + local_278)) {
        uVar18 = 0xf;
        if (local_d0 != local_c0) {
          uVar18 = local_c0[0];
        }
        if (uVar18 < (ulong)(local_c8 + local_278)) goto LAB_00229d52;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_280);
      }
      else {
LAB_00229d52:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_d0);
      }
      local_2a8 = &local_298;
      plVar6 = puVar5 + 2;
      if ((long *)*puVar5 == plVar6) {
        local_298 = *plVar6;
        lStack_290 = puVar5[3];
      }
      else {
        local_298 = *plVar6;
        local_2a8 = (long *)*puVar5;
      }
      local_2a0 = puVar5[1];
      *puVar5 = plVar6;
      puVar5[1] = 0;
      *(undefined1 *)plVar6 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_260 = &local_250;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_250 = *puVar10;
        lStack_248 = plVar6[3];
      }
      else {
        local_250 = *puVar10;
        local_260 = (ulong *)*plVar6;
      }
      local_258 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_308);
      local_2c8 = &local_2b8;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_2b8 = *puVar10;
        lStack_2b0 = plVar6[3];
      }
      else {
        local_2b8 = *puVar10;
        local_2c8 = (ulong *)*plVar6;
      }
      local_2c0 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_230 = *puVar10;
        lStack_228 = plVar6[3];
        local_240 = &local_230;
      }
      else {
        local_230 = *puVar10;
        local_240 = (ulong *)*plVar6;
      }
      local_238 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct((ulong)&local_f0,'\x06');
      uVar18 = 0xf;
      if (local_240 != &local_230) {
        uVar18 = local_230;
      }
      if (uVar18 < (ulong)(local_e8 + local_238)) {
        uVar18 = 0xf;
        if (local_f0 != local_e0) {
          uVar18 = local_e0[0];
        }
        if (uVar18 < (ulong)(local_e8 + local_238)) goto LAB_00229f7c;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_240);
      }
      else {
LAB_00229f7c:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_f0);
      }
      local_2e8 = &local_2d8;
      puVar10 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar10) {
        local_2d8 = *puVar10;
        lStack_2d0 = puVar5[3];
      }
      else {
        local_2d8 = *puVar10;
        local_2e8 = (ulong *)*puVar5;
      }
      local_2e0 = puVar5[1];
      *puVar5 = puVar10;
      puVar5[1] = 0;
      *(undefined1 *)puVar10 = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
      local_328 = &local_318;
      puVar10 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar10) {
        local_318 = *puVar10;
        lStack_310 = puVar5[3];
      }
      else {
        local_318 = *puVar10;
        local_328 = (ulong *)*puVar5;
      }
      local_320 = puVar5[1];
      *puVar5 = puVar10;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      local_110 = local_100;
      std::__cxx11::string::_M_construct((ulong)&local_110,'\x06');
      uVar18 = 0xf;
      if (local_328 != &local_318) {
        uVar18 = local_318;
      }
      if (uVar18 < (ulong)(local_108 + local_320)) {
        uVar18 = 0xf;
        if (local_110 != local_100) {
          uVar18 = local_100[0];
        }
        if (uVar18 < (ulong)(local_108 + local_320)) goto LAB_0022a0ca;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_328);
      }
      else {
LAB_0022a0ca:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_110);
      }
      psVar11 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_348.field_2._M_allocated_capacity = *psVar11;
        local_348.field_2._8_8_ = puVar5[3];
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      }
      else {
        local_348.field_2._M_allocated_capacity = *psVar11;
        local_348._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_348._M_string_length = puVar5[1];
      *puVar5 = psVar11;
      puVar5[1] = 0;
      *(undefined1 *)psVar11 = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      local_368 = &local_358;
      puVar10 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar10) {
        local_358 = *puVar10;
        lStack_350 = puVar5[3];
      }
      else {
        local_358 = *puVar10;
        local_368 = (ulong *)*puVar5;
      }
      local_360 = puVar5[1];
      *puVar5 = puVar10;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_368);
      if (local_368 != &local_358) {
        operator_delete(local_368);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if (local_110 != local_100) {
        operator_delete(local_110);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
      if (local_280 != &local_270) {
        operator_delete(local_280);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
      }
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0);
      }
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_220 != &local_210) {
        operator_delete(local_220);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308);
      }
    }
    uVar18 = local_118 + 1;
  } while( true );
}

Assistant:

std::string CppGenerator::genDumpFunction()
{
    std::string returnString = "#ifdef DUMP_OUTPUT\n"+
        offset(1)+"void dumpOutputViews()\n"+offset(1)+"{\n"+
        offset(2)+"std::ofstream ofs;\n";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);

        if (view->_origin != view->_destination)
            continue;

        returnString += offset(2)+"ofs.open(\"output/"+
            viewName[viewID]+".tbl\");\n"+
            offset(2)+"ofs << \""+std::to_string(view->_fVars.count())+" "+
            std::to_string(view->_aggregates.size())+"\\n\";\n";
            
        std::string fields = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* attr = _td->getAttribute(var);
                fields += " << tuple."+attr->_name+" <<\"|\"";
            }
        }

        for (size_t agg = 0; agg < view->_aggregates.size(); ++agg)
            fields += " << tuple.aggregates["+std::to_string(agg)+"] << \"|\"";

        fields.pop_back();
        fields.pop_back();
        fields.pop_back();
        
        returnString += offset(2)+"for (size_t i=0; i < "+viewName[viewID]+
            ".size(); ++i)\n"+offset(2)+"{\n"+offset(3)+
            viewName[viewID]+"_tuple& tuple = "+viewName[viewID]+"[i];\n"+
            offset(3)+"ofs "+fields+"\"\\n\";\n"+offset(2)+"}\n"+
            offset(2)+"ofs.close();\n";
    }

    returnString += offset(1)+"}\n"+"#endif\n";
    return returnString;
}